

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void scan_row_mbmi(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_col,MV_REFERENCE_FRAME *rf,int row_offset,
                  CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,uint8_t *refmv_count,
                  uint8_t *ref_match_count,uint8_t *newmv_count,int_mv *gm_mv_candidates,
                  int max_row_offset,int *processed_rows)

{
  byte bVar1;
  uint16_t *ref_mv_weight_00;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  WarpedMotionParams *gm_params;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_stack_00000030;
  int *in_stack_00000038;
  uint16_t inc;
  uint16_t weight;
  int len;
  int n4_w;
  int candidate_bsize;
  MB_MODE_INFO *candidate;
  int i;
  MB_MODE_INFO **candidate_mi0;
  int use_step_16;
  int col_offset;
  int width_16x16;
  int width_8x8;
  int end_mi;
  CANDIDATE_MV *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ushort in_stack_ffffffffffffff80;
  undefined2 uVar9;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff98;
  int iVar11;
  uint16_t in_stack_ffffffffffffffa8;
  int local_50;
  
  if ((int)(uint)*(byte *)(in_RSI + 0x2074) < (int)(*(int *)(in_RDI + 0x218) - in_EDX)) {
    uVar2 = (uint)*(byte *)(in_RSI + 0x2074);
  }
  else {
    uVar2 = *(int *)(in_RDI + 0x218) - in_EDX;
  }
  uVar7 = uVar2;
  if (0xf < (int)uVar2) {
    uVar7 = 0x10;
  }
  local_50 = 0;
  iVar11 = in_R8D;
  if (in_R8D < 1) {
    iVar11 = -in_R8D;
  }
  if (((1 < iVar11) && (local_50 = 1, (in_EDX & 1) != 0)) && (*(byte *)(in_RSI + 0x2074) < 2)) {
    local_50 = 0;
  }
  bVar1 = *(byte *)(in_RSI + 0x2074);
  gm_params = (WarpedMotionParams *)
              (*(long *)(in_RSI + 0x1eb8) + (long)(in_R8D * *(int *)(in_RSI + 8)) * 8);
  uVar8 = uVar7;
  for (iVar11 = 0; iVar11 < (int)uVar7; iVar11 = uVar10 + iVar11) {
    ref_mv_weight_00 = *(uint16_t **)(gm_params->wmmat + (long)(local_50 + iVar11) * 2);
    uVar3 = (uint)(byte)*ref_mv_weight_00;
    uVar4 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [(int)uVar3];
    uVar6 = uVar4;
    if (*(byte *)(in_RSI + 0x2074) < uVar4) {
      uVar6 = (uint)*(byte *)(in_RSI + 0x2074);
    }
    uVar10 = uVar6;
    if (bVar1 < 0x10) {
      iVar5 = in_R8D;
      if (in_R8D < 1) {
        iVar5 = -in_R8D;
      }
      if ((1 < iVar5) && (in_stack_ffffffffffffff6c = uVar6, uVar6 < 3)) {
        in_stack_ffffffffffffff6c = 2;
        uVar10 = 2;
      }
    }
    else {
      in_stack_ffffffffffffff70 = uVar6;
      if (uVar6 < 4) {
        in_stack_ffffffffffffff70 = 4;
        uVar10 = 4;
      }
    }
    uVar9 = 2;
    if ((1 < *(byte *)(in_RSI + 0x2074)) && (*(byte *)(in_RSI + 0x2074) <= uVar4)) {
      if ((in_R8D - in_stack_00000030) + 1 <
          (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [(int)uVar3]) {
        in_stack_ffffffffffffff68 = (in_R8D - in_stack_00000030) + 1;
      }
      else {
        in_stack_ffffffffffffff68 =
             (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [(int)uVar3];
      }
      in_stack_ffffffffffffff80 = (ushort)in_stack_ffffffffffffff68;
      if (in_stack_ffffffffffffff80 < 2) {
        in_stack_ffffffffffffff64 = 2;
      }
      else {
        in_stack_ffffffffffffff64 = in_stack_ffffffffffffff68 & 0xffff;
      }
      uVar9 = (undefined2)in_stack_ffffffffffffff64;
      *in_stack_00000038 = ((in_stack_ffffffffffffff68 & 0xffff) - in_R8D) + -1;
    }
    add_ref_mv_candidate
              ((MB_MODE_INFO *)CONCAT44(uVar10,CONCAT22(uVar9,in_stack_ffffffffffffff80)),
               (MV_REFERENCE_FRAME *)CONCAT44(uVar2,uVar8),
               (uint8_t *)CONCAT44(uVar6,in_stack_ffffffffffffff70),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (uint8_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,ref_mv_weight_00,
               (int_mv *)CONCAT44(iVar11,in_stack_ffffffffffffff98),gm_params,
               in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static inline void scan_row_mbmi(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                 int mi_col, const MV_REFERENCE_FRAME rf[2],
                                 int row_offset, CANDIDATE_MV *ref_mv_stack,
                                 uint16_t *ref_mv_weight, uint8_t *refmv_count,
                                 uint8_t *ref_match_count, uint8_t *newmv_count,
                                 int_mv *gm_mv_candidates, int max_row_offset,
                                 int *processed_rows) {
  int end_mi = AOMMIN(xd->width, cm->mi_params.mi_cols - mi_col);
  end_mi = AOMMIN(end_mi, mi_size_wide[BLOCK_64X64]);
  const int width_8x8 = mi_size_wide[BLOCK_8X8];
  const int width_16x16 = mi_size_wide[BLOCK_16X16];
  int col_offset = 0;
  // TODO(jingning): Revisit this part after cb4x4 is stable.
  if (abs(row_offset) > 1) {
    col_offset = 1;
    if ((mi_col & 0x01) && xd->width < width_8x8) --col_offset;
  }
  const int use_step_16 = (xd->width >= 16);
  MB_MODE_INFO **const candidate_mi0 = xd->mi + row_offset * xd->mi_stride;

  for (int i = 0; i < end_mi;) {
    const MB_MODE_INFO *const candidate = candidate_mi0[col_offset + i];
    const int candidate_bsize = candidate->bsize;
    const int n4_w = mi_size_wide[candidate_bsize];
    int len = AOMMIN(xd->width, n4_w);
    if (use_step_16)
      len = AOMMAX(width_16x16, len);
    else if (abs(row_offset) > 1)
      len = AOMMAX(len, width_8x8);

    uint16_t weight = 2;
    if (xd->width >= width_8x8 && xd->width <= n4_w) {
      uint16_t inc = AOMMIN(-max_row_offset + row_offset + 1,
                            mi_size_high[candidate_bsize]);
      // Obtain range used in weight calculation.
      weight = AOMMAX(weight, inc);
      // Update processed rows.
      *processed_rows = inc - row_offset - 1;
    }

    add_ref_mv_candidate(candidate, rf, refmv_count, ref_match_count,
                         newmv_count, ref_mv_stack, ref_mv_weight,
                         gm_mv_candidates, cm->global_motion, len * weight);

    i += len;
  }
}